

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

ExpandMacroResult __thiscall
anon_unknown.dwarf_78b129::EnvironmentMacroExpander<cmCMakePresetsGraph::ConfigurePreset>::
operator()(EnvironmentMacroExpander<cmCMakePresetsGraph::ConfigurePreset> *this,
          string *macroNamespace,string *macroName,string *macroOut,int version)

{
  bool bVar1;
  ExpandMacroResult EVar2;
  iterator iVar3;
  mapped_type *status;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  
  bVar1 = std::operator==(macroNamespace,"env");
  if ((((bVar1) && (macroName->_M_string_length != 0)) &&
      ((this->Out->super__Optional_base<cmCMakePresetsGraph::ConfigurePreset,_false,_false>).
       _M_payload.super__Optional_payload<cmCMakePresetsGraph::ConfigurePreset,_true,_false,_false>.
       super__Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>._M_engaged == true)) &&
     ((iVar3 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::find(&(this->Out->
                       super__Optional_base<cmCMakePresetsGraph::ConfigurePreset,_false,_false>).
                       _M_payload.
                       super__Optional_payload<cmCMakePresetsGraph::ConfigurePreset,_true,_false,_false>
                       .super__Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>.
                       _M_payload._M_value.super_Preset.Environment._M_t,macroName),
      iVar3._M_node !=
      (_Base_ptr)
      ((long)&(this->Out->super__Optional_base<cmCMakePresetsGraph::ConfigurePreset,_false,_false>).
              _M_payload.
              super__Optional_payload<cmCMakePresetsGraph::ConfigurePreset,_true,_false,_false>.
              super__Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>._M_payload + 0xb0)
      && ((char)iVar3._M_node[3]._M_color == _S_black)))) {
    status = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
             ::operator[](this->EnvCycles,macroName);
    EVar2 = VisitEnv((string *)(iVar3._M_node + 2),status,this->MacroExpanders,version);
    if (EVar2 != Ok) {
      return EVar2;
    }
    std::__cxx11::string::append((string *)macroOut);
  }
  else {
    bVar1 = std::operator==(macroNamespace,"env");
    if ((!bVar1) && (bVar1 = std::operator==(macroNamespace,"penv"), !bVar1)) {
      return Ignore;
    }
    if (macroName->_M_string_length == 0) {
      return Error;
    }
    cmSystemTools::GetEnvVar(&value,macroName);
    if (value.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      std::__cxx11::string::append((string *)macroOut);
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&value);
  }
  return Ok;
}

Assistant:

ExpandMacroResult operator()(const std::string& macroNamespace,
                               const std::string& macroName,
                               std::string& macroOut,
                               int version) const override
  {
    if (macroNamespace == "env" && !macroName.empty() && Out) {
      auto v = Out->Environment.find(macroName);
      if (v != Out->Environment.end() && v->second) {
        auto e =
          VisitEnv(*v->second, EnvCycles[macroName], MacroExpanders, version);
        if (e != ExpandMacroResult::Ok) {
          return e;
        }
        macroOut += *v->second;
        return ExpandMacroResult::Ok;
      }
    }

    if (macroNamespace == "env" || macroNamespace == "penv") {
      if (macroName.empty()) {
        return ExpandMacroResult::Error;
      }
      if (cm::optional<std::string> value =
            cmSystemTools::GetEnvVar(macroName)) {
        macroOut += *value;
      }
      return ExpandMacroResult::Ok;
    }

    return ExpandMacroResult::Ignore;
  }